

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRD2File.cpp
# Opt level: O1

bool BRD2File::verifyFormat(vector<char,_std::allocator<char>_> *buf)

{
  bool bVar1;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BRDOUT:","");
  bVar1 = find_str_in_buf(&local_40,buf);
  if (bVar1) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"NETS:","");
    bVar1 = find_str_in_buf(&local_60,buf);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool BRD2File::verifyFormat(std::vector<char> &buf) {
	return find_str_in_buf("BRDOUT:", buf) && find_str_in_buf("NETS:", buf);
}